

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O3

QList<std::pair<int,_int>_> * __thiscall
QTreeViewPrivate::columnRanges
          (QList<std::pair<int,_int>_> *__return_storage_ptr__,QTreeViewPrivate *this,
          QModelIndex *topIndex,QModelIndex *bottomIndex)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  iterator iVar5;
  iterator iVar6;
  ulong uVar7;
  ulong uVar8;
  int c;
  int iVar9;
  long in_FS_OFFSET;
  QList<std::pair<int,_int>_> *ret;
  pair<int,_int> local_60;
  QList<int> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = QHeaderView::visualIndex(this->header,topIndex->c);
  iVar4 = QHeaderView::visualIndex(this->header,bottomIndex->c);
  iVar9 = iVar4;
  if (iVar3 < iVar4) {
    iVar9 = iVar3;
  }
  if (iVar4 < iVar3) {
    iVar4 = iVar3;
  }
  local_58.d.d = (Data *)0x0;
  local_58.d.ptr = (int *)0x0;
  local_58.d.size = 0;
  do {
    iVar3 = QHeaderView::logicalIndex(this->header,iVar9);
    bVar2 = QHeaderView::isSectionHidden(this->header,iVar3);
    if (!bVar2) {
      local_60.first = iVar3;
      QtPrivate::QPodArrayOps<int>::emplace<int&>
                ((QPodArrayOps<int> *)&local_58,local_58.d.size,&local_60.first);
      QList<int>::end(&local_58);
    }
    iVar9 = iVar9 + 1;
  } while (iVar4 + 1 != iVar9);
  iVar5 = QList<int>::begin(&local_58);
  iVar6 = QList<int>::end(&local_58);
  if (iVar5.i != iVar6.i) {
    uVar7 = (long)iVar6.i - (long)iVar5.i >> 2;
    lVar1 = 0x3f;
    if (uVar7 != 0) {
      for (; uVar7 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    std::__introsort_loop<QList<int>::iterator,long_long,__gnu_cxx::__ops::_Iter_less_iter>
              (iVar5.i,iVar6.i,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
    std::__final_insertion_sort<QList<int>::iterator,__gnu_cxx::__ops::_Iter_less_iter>
              (iVar5.i,iVar6.i);
  }
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (pair<int,_int> *)0x0;
  (__return_storage_ptr__->d).size = 0;
  local_60.first = -2;
  local_60.second = -2;
  if (local_58.d.size != 0) {
    iVar4 = -2;
    uVar8 = 0;
    uVar7 = local_58.d.size;
    iVar9 = -2;
    do {
      iVar3 = local_58.d.ptr[uVar8];
      if (iVar9 + 1 == iVar3) {
        iVar9 = local_60.first;
      }
      else {
        bVar2 = iVar4 != -2;
        iVar4 = iVar3;
        iVar9 = iVar3;
        if (bVar2) {
          QtPrivate::QPodArrayOps<std::pair<int,int>>::emplace<std::pair<int,int>const&>
                    ((QPodArrayOps<std::pair<int,int>> *)__return_storage_ptr__,
                     (__return_storage_ptr__->d).size,&local_60);
          QList<std::pair<int,_int>_>::end(__return_storage_ptr__);
          uVar7 = local_58.d.size;
        }
      }
      local_60.second = iVar3;
      local_60.first = iVar9;
      uVar8 = uVar8 + 1;
      iVar9 = iVar3;
    } while (uVar8 < uVar7);
    if (iVar4 != -2) {
      QtPrivate::QPodArrayOps<std::pair<int,int>>::emplace<std::pair<int,int>const&>
                ((QPodArrayOps<std::pair<int,int>> *)__return_storage_ptr__,
                 (__return_storage_ptr__->d).size,&local_60);
      QList<std::pair<int,_int>_>::end(__return_storage_ptr__);
    }
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,4,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QList<std::pair<int, int>> QTreeViewPrivate::columnRanges(const QModelIndex &topIndex,
                                                          const QModelIndex &bottomIndex) const
{
    const int topVisual = header->visualIndex(topIndex.column()),
        bottomVisual = header->visualIndex(bottomIndex.column());

    const int start = qMin(topVisual, bottomVisual);
    const int end = qMax(topVisual, bottomVisual);

    QList<int> logicalIndexes;

    //we iterate over the visual indexes to get the logical indexes
    for (int c = start; c <= end; c++) {
        const int logical = header->logicalIndex(c);
        if (!header->isSectionHidden(logical)) {
            logicalIndexes << logical;
        }
    }
    //let's sort the list
    std::sort(logicalIndexes.begin(), logicalIndexes.end());

    QList<std::pair<int, int>> ret;
    std::pair<int, int> current;
    current.first = -2; // -1 is not enough because -1+1 = 0
    current.second = -2;
    for(int i = 0; i < logicalIndexes.size(); ++i) {
        const int logicalColumn = logicalIndexes.at(i);
        if (current.second + 1 != logicalColumn) {
            if (current.first != -2) {
                //let's save the current one
                ret += current;
            }
            //let's start a new one
            current.first = current.second = logicalColumn;
        } else {
            current.second++;
        }
    }

    //let's get the last range
    if (current.first != -2) {
        ret += current;
    }

    return ret;
}